

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

int leveldb::FindFile(InternalKeyComparator *icmp,
                     vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     *files,Slice *key)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  const_reference ppFVar5;
  Slice *in_RSI;
  Slice *in_RDI;
  long in_FS_OFFSET;
  Slice SVar6;
  FileMetaData *f;
  uint32_t mid;
  uint32_t right;
  uint32_t left;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Slice *in_stack_ffffffffffffffb0;
  value_type in_stack_ffffffffffffffb8;
  uint local_38;
  uint local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  uVar2 = (uint)sVar4;
  while (local_38 = uVar2, local_34 < local_38) {
    uVar2 = local_34 + local_38 >> 1;
    ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)in_stack_ffffffffffffffb8,(size_type)in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffb0 = in_RDI;
    in_stack_ffffffffffffffb8 = *ppFVar5;
    in_RDI = in_stack_ffffffffffffffb0;
    SVar6 = InternalKey::Encode((InternalKey *)in_stack_ffffffffffffffb8);
    iVar3 = InternalKeyComparator::Compare((InternalKeyComparator *)SVar6.data_,in_RDI,in_RSI);
    if (iVar3 < 0) {
      local_34 = uVar2 + 1;
      uVar2 = local_38;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

int FindFile(const InternalKeyComparator& icmp,
             const std::vector<FileMetaData*>& files, const Slice& key) {
  uint32_t left = 0;
  uint32_t right = files.size();
  while (left < right) {
    uint32_t mid = (left + right) / 2;
    const FileMetaData* f = files[mid];
    if (icmp.InternalKeyComparator::Compare(f->largest.Encode(), key) < 0) {
      // Key at "mid.largest" is < "target".  Therefore all
      // files at or before "mid" are uninteresting.
      left = mid + 1;
    } else {
      // Key at "mid.largest" is >= "target".  Therefore all files
      // after "mid" are uninteresting.
      right = mid;
    }
  }
  return right;
}